

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int s_mp_exptmod(mp_int *G,mp_int *X,mp_int *P,mp_int *Y,int redmode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  mp_int *in_RCX;
  undefined8 in_RDX;
  mp_int *in_RSI;
  int in_R8D;
  _func_int_mp_int_ptr_mp_int_ptr_mp_int_ptr *redux;
  int winsize;
  int y;
  int x;
  int digidx;
  int mode;
  int bitcnt;
  int bitcpy;
  int bitbuf;
  int err;
  mp_digit buf;
  mp_int mu;
  mp_int res;
  mp_int M [256];
  mp_int *in_stack_ffffffffffffe758;
  code *in_stack_ffffffffffffe760;
  undefined4 in_stack_ffffffffffffe768;
  uint in_stack_ffffffffffffe770;
  int iVar4;
  undefined4 in_stack_ffffffffffffe778;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffe77c;
  int iVar6;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffe780;
  int iVar8;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffe784;
  int iVar10;
  uint in_stack_ffffffffffffe788;
  uint uVar11;
  mp_digit local_1870;
  undefined1 local_1868 [24];
  mp_int local_1850;
  undefined1 local_1838 [6156];
  int local_2c;
  mp_int *local_28;
  undefined8 local_20;
  mp_int *local_18;
  
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  iVar1 = mp_count_bits(in_RSI);
  if (iVar1 < 8) {
    iVar1 = 2;
  }
  else if (iVar1 < 0x25) {
    iVar1 = 3;
  }
  else if (iVar1 < 0x8d) {
    iVar1 = 4;
  }
  else if (iVar1 < 0x1c3) {
    iVar1 = 5;
  }
  else if (iVar1 < 0x518) {
    iVar1 = 6;
  }
  else if (iVar1 < 0xdca) {
    iVar1 = 7;
  }
  else {
    iVar1 = 8;
  }
  iVar2 = mp_init(in_stack_ffffffffffffe758);
  if (iVar2 != 0) {
    return iVar2;
  }
  for (iVar2 = 1 << ((char)iVar1 - 1U & 0x1f); iVar2 < 1 << ((byte)iVar1 & 0x1f); iVar2 = iVar2 + 1)
  {
    iVar3 = mp_init(in_stack_ffffffffffffe758);
    if (iVar3 != 0) {
      for (iVar1 = 1 << ((char)iVar1 - 1U & 0x1f); iVar1 < iVar2; iVar1 = iVar1 + 1) {
        mp_clear((mp_int *)in_stack_ffffffffffffe760);
      }
      mp_clear((mp_int *)in_stack_ffffffffffffe760);
      return iVar3;
    }
  }
  iVar3 = mp_init(in_stack_ffffffffffffe758);
  if (iVar3 != 0) goto LAB_0010b3d0;
  if (local_2c == 0) {
    iVar3 = mp_reduce_setup((mp_int *)CONCAT44(iVar1,in_stack_ffffffffffffe768),
                            (mp_int *)in_stack_ffffffffffffe760);
    if (iVar3 == 0) {
      in_stack_ffffffffffffe760 = mp_reduce;
LAB_0010aeb0:
      iVar3 = mp_mod((mp_int *)(ulong)in_stack_ffffffffffffe788,
                     (mp_int *)CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                     (mp_int *)CONCAT44(in_stack_ffffffffffffe77c,in_stack_ffffffffffffe778));
      if ((iVar3 == 0) &&
         (iVar3 = mp_copy((mp_int *)CONCAT44(in_stack_ffffffffffffe77c,in_stack_ffffffffffffe778),
                          (mp_int *)CONCAT44(iVar2,in_stack_ffffffffffffe770)), iVar3 == 0)) {
        for (iVar2 = 0; iVar2 < iVar1 + -1; iVar2 = iVar2 + 1) {
          iVar3 = mp_sqr((mp_int *)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
          if ((iVar3 != 0) ||
             (iVar3 = (*in_stack_ffffffffffffe760)
                                (local_1838 + (long)(1 << ((char)iVar1 - 1U & 0x1f)) * 0x18,local_20
                                 ,local_1868), iVar3 != 0)) goto LAB_0010b3c6;
        }
        iVar2 = 1 << ((char)iVar1 - 1U & 0x1f);
        while (iVar2 = iVar2 + 1, iVar2 < 1 << ((byte)iVar1 & 0x1f)) {
          iVar3 = mp_mul((mp_int *)CONCAT44(in_stack_ffffffffffffe784,in_stack_ffffffffffffe780),
                         (mp_int *)CONCAT44(in_stack_ffffffffffffe77c,in_stack_ffffffffffffe778),
                         (mp_int *)CONCAT44(iVar2,in_stack_ffffffffffffe770));
          if ((iVar3 != 0) ||
             (iVar3 = (*in_stack_ffffffffffffe760)
                                (local_1838 + (long)iVar2 * 0x18,local_20,local_1868), iVar3 != 0))
          goto LAB_0010b3c6;
        }
        iVar3 = mp_init(in_stack_ffffffffffffe758);
        if (iVar3 == 0) {
          mp_set((mp_int *)in_stack_ffffffffffffe760,(mp_digit)in_stack_ffffffffffffe758);
          iVar6 = 0;
          iVar8 = 1;
          local_1870 = 0;
          iVar2 = local_18->used + -1;
          iVar10 = 0;
          uVar11 = 0;
          goto LAB_0010b0e3;
        }
      }
    }
  }
  else {
    iVar3 = mp_reduce_2k_setup_l
                      ((mp_int *)CONCAT44(in_stack_ffffffffffffe77c,in_stack_ffffffffffffe778),
                       (mp_int *)CONCAT44(iVar2,in_stack_ffffffffffffe770));
    if (iVar3 == 0) {
      in_stack_ffffffffffffe760 = mp_reduce_2k_l;
      goto LAB_0010aeb0;
    }
  }
LAB_0010b3c6:
  mp_clear((mp_int *)in_stack_ffffffffffffe760);
LAB_0010b3d0:
  mp_clear((mp_int *)in_stack_ffffffffffffe760);
  for (iVar2 = 1 << ((char)iVar1 - 1U & 0x1f); iVar2 < 1 << ((byte)iVar1 & 0x1f); iVar2 = iVar2 + 1)
  {
    mp_clear((mp_int *)in_stack_ffffffffffffe760);
  }
  return iVar3;
LAB_0010b0e3:
  do {
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      if (iVar2 == -1) {
        if ((iVar6 != 2) || (iVar10 < 1)) goto LAB_0010b3a2;
        iVar2 = 0;
        uVar9 = 0;
        uVar5 = 0xffffffff;
        uVar7 = 2;
        goto LAB_0010b2d5;
      }
      local_1870 = local_18->dp[iVar2];
      iVar8 = 0x3c;
      iVar2 = iVar2 + -1;
    }
    in_stack_ffffffffffffe770 = (uint)(local_1870 >> 0x3b) & 1;
    local_1870 = local_1870 << 1;
  } while ((iVar6 == 0) && (in_stack_ffffffffffffe770 == 0));
  if ((iVar6 != 1) || (in_stack_ffffffffffffe770 != 0)) {
    iVar10 = iVar10 + 1;
    uVar11 = in_stack_ffffffffffffe770 << ((char)iVar1 - (char)iVar10 & 0x1fU) | uVar11;
    iVar6 = 2;
    if (iVar10 == iVar1) {
      for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
        iVar3 = mp_sqr((mp_int *)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
        if ((iVar3 != 0) ||
           (iVar3 = (*in_stack_ffffffffffffe760)(&local_1850,local_20,local_1868), iVar3 != 0))
        goto LAB_0010b3bc;
      }
      iVar3 = mp_mul((mp_int *)CONCAT44(iVar10,iVar8),(mp_int *)CONCAT44(iVar6,iVar2),
                     (mp_int *)CONCAT44(iVar4,in_stack_ffffffffffffe770));
      if ((iVar3 != 0) ||
         (iVar3 = (*in_stack_ffffffffffffe760)(&local_1850,local_20,local_1868), iVar3 != 0))
      goto LAB_0010b3bc;
      iVar10 = 0;
      uVar11 = 0;
      iVar6 = 1;
    }
    goto LAB_0010b0e3;
  }
  iVar3 = mp_sqr((mp_int *)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
  if ((iVar3 != 0) ||
     (iVar3 = (*in_stack_ffffffffffffe760)(&local_1850,local_20,local_1868), iVar3 != 0))
  goto LAB_0010b3bc;
  goto LAB_0010b0e3;
LAB_0010b2d5:
  if (iVar10 <= iVar2) goto LAB_0010b3a2;
  iVar3 = mp_sqr((mp_int *)in_stack_ffffffffffffe760,in_stack_ffffffffffffe758);
  if (((iVar3 != 0) ||
      (iVar3 = (*in_stack_ffffffffffffe760)(&local_1850,local_20,local_1868), iVar3 != 0)) ||
     ((uVar11 = uVar11 << 1, (uVar11 & 1 << ((byte)iVar1 & 0x1f)) != 0 &&
      ((iVar3 = mp_mul((mp_int *)CONCAT44(iVar10,uVar9),(mp_int *)CONCAT44(uVar7,uVar5),
                       (mp_int *)CONCAT44(iVar2,in_stack_ffffffffffffe770)), iVar3 != 0 ||
       (iVar3 = (*in_stack_ffffffffffffe760)(&local_1850,local_20,local_1868), iVar3 != 0))))))
  goto LAB_0010b3bc;
  iVar2 = iVar2 + 1;
  goto LAB_0010b2d5;
LAB_0010b3a2:
  mp_exch(&local_1850,local_28);
  iVar3 = 0;
LAB_0010b3bc:
  mp_clear((mp_int *)in_stack_ffffffffffffe760);
  goto LAB_0010b3c6;
}

Assistant:

int s_mp_exptmod (mp_int * G, mp_int * X, mp_int * P, mp_int * Y, int redmode)
{
  mp_int  M[TAB_SIZE], res, mu;
  mp_digit buf;
  int     err, bitbuf, bitcpy, bitcnt, mode, digidx, x, y, winsize;
  int (*redux)(mp_int*,mp_int*,mp_int*);

  /* find window size */
  x = mp_count_bits (X);
  if (x <= 7) {
    winsize = 2;
  } else if (x <= 36) {
    winsize = 3;
  } else if (x <= 140) {
    winsize = 4;
  } else if (x <= 450) {
    winsize = 5;
  } else if (x <= 1303) {
    winsize = 6;
  } else if (x <= 3529) {
    winsize = 7;
  } else {
    winsize = 8;
  }

  /* init M array */
  /* init first cell */
  if ((err = mp_init(&M[1])) != MP_OKAY) {
     return err; 
  }

  /* now init the second half of the array */
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    if ((err = mp_init(&M[x])) != MP_OKAY) {
      for (y = 1<<(winsize-1); y < x; y++) {
        mp_clear (&M[y]);
      }
      mp_clear(&M[1]);
      return err;
    }
  }

  /* create mu, used for Barrett reduction */
  if ((err = mp_init (&mu)) != MP_OKAY) {
    goto LBL_M;
  }
  
  if (redmode == 0) {
     if ((err = mp_reduce_setup (&mu, P)) != MP_OKAY) {
        goto LBL_MU;
     }
     redux = mp_reduce;
  } else {
     if ((err = mp_reduce_2k_setup_l (P, &mu)) != MP_OKAY) {
        goto LBL_MU;
     }
     redux = mp_reduce_2k_l;
  }    

  /* create M table
   *
   * The M table contains powers of the base, 
   * e.g. M[x] = G**x mod P
   *
   * The first half of the table is not 
   * computed though accept for M[0] and M[1]
   */
  if ((err = mp_mod (G, P, &M[1])) != MP_OKAY) {
    goto LBL_MU;
  }

  /* compute the value at M[1<<(winsize-1)] by squaring 
   * M[1] (winsize-1) times 
   */
  if ((err = mp_copy (&M[1], &M[1 << (winsize - 1)])) != MP_OKAY) {
    goto LBL_MU;
  }

  for (x = 0; x < (winsize - 1); x++) {
    /* square it */
    if ((err = mp_sqr (&M[1 << (winsize - 1)], 
                       &M[1 << (winsize - 1)])) != MP_OKAY) {
      goto LBL_MU;
    }

    /* reduce modulo P */
    if ((err = redux (&M[1 << (winsize - 1)], P, &mu)) != MP_OKAY) {
      goto LBL_MU;
    }
  }

  /* create upper table, that is M[x] = M[x-1] * M[1] (mod P)
   * for x = (2**(winsize - 1) + 1) to (2**winsize - 1)
   */
  for (x = (1 << (winsize - 1)) + 1; x < (1 << winsize); x++) {
    if ((err = mp_mul (&M[x - 1], &M[1], &M[x])) != MP_OKAY) {
      goto LBL_MU;
    }
    if ((err = redux (&M[x], P, &mu)) != MP_OKAY) {
      goto LBL_MU;
    }
  }

  /* setup result */
  if ((err = mp_init (&res)) != MP_OKAY) {
    goto LBL_MU;
  }
  mp_set (&res, 1);

  /* set initial mode and bit cnt */
  mode   = 0;
  bitcnt = 1;
  buf    = 0;
  digidx = X->used - 1;
  bitcpy = 0;
  bitbuf = 0;

  for (;;) {
    /* grab next digit as required */
    if (--bitcnt == 0) {
      /* if digidx == -1 we are out of digits */
      if (digidx == -1) {
        break;
      }
      /* read next digit and reset the bitcnt */
      buf    = X->dp[digidx--];
      bitcnt = (int) DIGIT_BIT;
    }

    /* grab the next msb from the exponent */
    y     = (buf >> (mp_digit)(DIGIT_BIT - 1)) & 1;
    buf <<= (mp_digit)1;

    /* if the bit is zero and mode == 0 then we ignore it
     * These represent the leading zero bits before the first 1 bit
     * in the exponent.  Technically this opt is not required but it
     * does lower the # of trivial squaring/reductions used
     */
    if (mode == 0 && y == 0) {
      continue;
    }

    /* if the bit is zero and mode == 1 then we square */
    if (mode == 1 && y == 0) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }
      continue;
    }

    /* else we add it to the window */
    bitbuf |= (y << (winsize - ++bitcpy));
    mode    = 2;

    if (bitcpy == winsize) {
      /* ok window is filled so square as required and multiply  */
      /* square first */
      for (x = 0; x < winsize; x++) {
        if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, &mu)) != MP_OKAY) {
          goto LBL_RES;
        }
      }

      /* then multiply */
      if ((err = mp_mul (&res, &M[bitbuf], &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }

      /* empty window and reset */
      bitcpy = 0;
      bitbuf = 0;
      mode   = 1;
    }
  }

  /* if bits remain then square/multiply */
  if (mode == 2 && bitcpy > 0) {
    /* square then multiply if the bit is set */
    for (x = 0; x < bitcpy; x++) {
      if ((err = mp_sqr (&res, &res)) != MP_OKAY) {
        goto LBL_RES;
      }
      if ((err = redux (&res, P, &mu)) != MP_OKAY) {
        goto LBL_RES;
      }

      bitbuf <<= 1;
      if ((bitbuf & (1 << winsize)) != 0) {
        /* then multiply */
        if ((err = mp_mul (&res, &M[1], &res)) != MP_OKAY) {
          goto LBL_RES;
        }
        if ((err = redux (&res, P, &mu)) != MP_OKAY) {
          goto LBL_RES;
        }
      }
    }
  }

  mp_exch (&res, Y);
  err = MP_OKAY;
LBL_RES:mp_clear (&res);
LBL_MU:mp_clear (&mu);
LBL_M:
  mp_clear(&M[1]);
  for (x = 1<<(winsize-1); x < (1 << winsize); x++) {
    mp_clear (&M[x]);
  }
  return err;
}